

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qformlayout.cpp
# Opt level: O1

QLayoutItem * __thiscall QFormLayout::takeAt(QFormLayout *this,int index)

{
  long lVar1;
  long *plVar2;
  long lVar3;
  QFormLayoutItem *item;
  long lVar4;
  pointer ppQVar5;
  QLayoutItem *pQVar6;
  int iVar7;
  long in_RCX;
  long lVar8;
  ulong i;
  long in_FS_OFFSET;
  char local_58 [24];
  char *local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  lVar3 = *(long *)&(this->super_QLayout).field_0x8;
  i = (ulong)index;
  if (i < *(ulong *)(lVar3 + 0xe8)) {
    lVar4 = *(long *)(*(long *)(lVar3 + 0xe0) + i * 8);
  }
  else {
    lVar4 = 0;
  }
  if (lVar4 == 0) {
    iVar7 = -1;
  }
  else {
    if (*(long *)(lVar3 + 0xd0) != 0) {
      lVar8 = -8;
      do {
        iVar7 = (int)in_RCX;
        lVar1 = *(long *)(lVar3 + 0xd0) * -8 + lVar8;
        if (lVar1 == -8) goto LAB_003a1c14;
        in_RCX = lVar8 + 8;
        plVar2 = (long *)(*(long *)(lVar3 + 200) + 8 + lVar8);
        lVar8 = in_RCX;
      } while (*plVar2 != lVar4);
      iVar7 = (int)(in_RCX >> 3);
LAB_003a1c14:
      if (lVar1 != -8) goto LAB_003a1c28;
    }
    iVar7 = -1;
  }
LAB_003a1c28:
  if (iVar7 == -1) {
    local_58[0] = '\x02';
    local_58[1] = '\0';
    local_58[2] = '\0';
    local_58[3] = '\0';
    local_58[4] = '\0';
    local_58[5] = '\0';
    local_58[6] = '\0';
    local_58[7] = '\0';
    local_58[8] = '\0';
    local_58[9] = '\0';
    local_58[10] = '\0';
    local_58[0xb] = '\0';
    local_58[0xc] = '\0';
    local_58[0xd] = '\0';
    local_58[0xe] = '\0';
    local_58[0xf] = '\0';
    local_58[0x10] = '\0';
    local_58[0x11] = '\0';
    local_58[0x12] = '\0';
    local_58[0x13] = '\0';
    local_58[0x14] = '\0';
    local_58[0x15] = '\0';
    local_58[0x16] = '\0';
    local_58[0x17] = '\0';
    local_40 = "default";
    QMessageLogger::warning(local_58,"QFormLayout::takeAt: Invalid index %d",index);
    if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
      return (QLayoutItem *)0x0;
    }
  }
  else {
    ppQVar5 = QList<QFormLayoutItem_*>::data((QList<QFormLayoutItem_*> *)(lVar3 + 0xc0));
    item = ppQVar5[iVar7];
    QList<QFormLayoutItem_*>::removeAt((QList<QFormLayoutItem_*> *)(lVar3 + 0xd8),i);
    ppQVar5 = QList<QFormLayoutItem_*>::data((QList<QFormLayoutItem_*> *)(lVar3 + 0xc0));
    ppQVar5[iVar7] = (QFormLayoutItem *)0x0;
    (**(code **)(*(long *)&this->super_QLayout + 0x70))(this);
    if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
      pQVar6 = ownershipCleanedItem(item,this);
      return pQVar6;
    }
  }
  __stack_chk_fail();
}

Assistant:

QLayoutItem *QFormLayout::takeAt(int index)
{
    Q_D(QFormLayout);

    const int storageIndex = storageIndexFromLayoutItem(d->m_matrix, d->m_things.value(index));
    if (Q_UNLIKELY(storageIndex == -1)) {
        qWarning("QFormLayout::takeAt: Invalid index %d", index);
        return nullptr;
    }

    int row, col;
    QFormLayoutPrivate::ItemMatrix::storageIndexToPosition(storageIndex, &row, &col);
    Q_ASSERT(d->m_matrix(row, col));

    QFormLayoutItem *item = d->m_matrix(row, col);
    Q_ASSERT(item);
    d->m_things.removeAt(index);
    d->m_matrix(row, col) = 0;

    invalidate();

    return ownershipCleanedItem(item, this);
}